

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O1

void __thiscall ShellLinkHeader::parseShowCommand(ShellLinkHeader *this)

{
  ostream *poVar1;
  
  if ((this->ShowCommand).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[3] == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SW_SHOWNORMAL",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"The application is open and its window is open in a normal fashion.",0x43);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((this->ShowCommand).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[3] == 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SW_SHOWMAXIMIZED",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "The application is open, and keyboard focus is given to the application, but its window is not shown."
               ,0x65);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((this->ShowCommand).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[3] == 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SW_SHOWMINNOACTIVE",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "The application is open, but its window is not shown. It is not given the keyboard focus."
               ,0x59);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void ShellLinkHeader::parseShowCommand(){
        if (ShowCommand[3] == 1)
            cout << "SW_SHOWNORMAL" << endl << Utils::defaultOffsetDocInfo << "The application is open and its window is open in a normal fashion." << endl;
        if (ShowCommand[3] == 3)
            cout << "SW_SHOWMAXIMIZED" << endl << Utils::defaultOffsetDocInfo << "The application is open, and keyboard focus is given to the application, but its window is not shown." << endl;
        if (ShowCommand[3] == 7)
            cout << "SW_SHOWMINNOACTIVE" << endl << Utils::defaultOffsetDocInfo << "The application is open, but its window is not shown. It is not given the keyboard focus." << endl;
    }